

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TextureUnitTests::init(TextureUnitTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  uint uVar2;
  uint uVar3;
  int extraout_EAX;
  int iVar4;
  long *plVar5;
  TestNode *pTVar6;
  ulong uVar7;
  TestNode *node;
  long *plVar8;
  long lVar9;
  uint uVar10;
  char *name;
  string countGroupName;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  TestNode *local_1b8;
  TestNode *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar9 = 0;
  do {
    iVar4 = deqp::gles2::Functional::TextureUnitTests::init::unitCounts[lVar9];
    if (lVar9 == 3) {
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"all","");
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    plVar5 = (long *)std::__cxx11::string::append((char *)local_1f8);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_1c8 = *plVar8;
      lStack_1c0 = plVar5[3];
      local_1d8 = &local_1c8;
    }
    else {
      local_1c8 = *plVar8;
      local_1d8 = (long *)*plVar5;
    }
    local_1d0 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0],local_1e8[0] + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               (char *)local_1d8,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild((TestNode *)this,pTVar6);
    uVar7 = 0;
    local_1b8 = pTVar6;
    do {
      pTVar6 = local_1b8;
      uVar2 = (uint)uVar7;
      if (uVar2 < 4) {
        name = (char *)((long)&DAT_01c4271c + (long)(int)(&DAT_01c4271c)[uVar7]);
      }
      else {
        name = (char *)0x0;
        if (uVar2 == 4) {
          name = "mixed";
        }
      }
      node = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,name,
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild(pTVar6,node);
      uVar10 = 0;
      local_1b0 = node;
      do {
        pTVar6 = (TestNode *)operator_new(0x158);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::ostream::operator<<(local_1a8,uVar10);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar6,pCVar1->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_1f8[0],
                   glcts::fixed_sample_locations_values + 1);
        uVar3 = (uVar10 >> 0x10 ^ uVar10 ^ 0x3d) * 9;
        uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
        pTVar6[1]._vptr_TestNode = (_func_int **)pCVar1;
        pTVar6->_vptr_TestNode = (_func_int **)&PTR__TextureUnitCase_02189bf0;
        *(int *)&pTVar6[1].m_testCtx = iVar4;
        *(uint *)((long)&pTVar6[1].m_testCtx + 4) = uVar2;
        *(uint *)&pTVar6[1].m_name._M_dataplus._M_p = uVar3 >> 0xf ^ uVar3;
        memset(&pTVar6[1].m_name.field_2,0,200);
        tcu::TestNode::addChild(local_1b0,pTVar6);
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != 10);
      uVar7 = (ulong)(uVar2 + 1);
    } while (uVar2 + 1 != 5);
    iVar4 = 5;
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8 + 1);
      iVar4 = extraout_EAX;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  return iVar4;
}

Assistant:

void TextureUnitTests::init (void)
{
	const int numTestsPerGroup = 10;

	static const int unitCounts[] =
	{
		2,
		4,
		8,
		-1 // \note Negative stands for the implementation-specified maximum.
	};

	for (int unitCountNdx = 0; unitCountNdx < DE_LENGTH_OF_ARRAY(unitCounts); unitCountNdx++)
	{
		int numUnits = unitCounts[unitCountNdx];

		string countGroupName = (unitCounts[unitCountNdx] < 0 ? "all" : de::toString(numUnits)) + "_units";

		tcu::TestCaseGroup* countGroup = new tcu::TestCaseGroup(m_testCtx, countGroupName.c_str(), "");
		addChild(countGroup);

		DE_STATIC_ASSERT((int)TextureUnitCase::CASE_ONLY_2D == 0);

		for (int caseType = (int)TextureUnitCase::CASE_ONLY_2D; caseType < (int)TextureUnitCase::CASE_LAST; caseType++)
		{
			const char* caseTypeGroupName = (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_2D		? "only_2d"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_CUBE		? "only_cube"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_2D_ARRAY	? "only_2d_array"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_ONLY_3D		? "only_3d"
										  : (TextureUnitCase::CaseType)caseType == TextureUnitCase::CASE_MIXED			? "mixed"
										  : DE_NULL;

			DE_ASSERT(caseTypeGroupName != DE_NULL);

			tcu::TestCaseGroup* caseTypeGroup = new tcu::TestCaseGroup(m_testCtx, caseTypeGroupName, "");
			countGroup->addChild(caseTypeGroup);

			for (int testNdx = 0; testNdx < numTestsPerGroup; testNdx++)
				caseTypeGroup->addChild(new TextureUnitCase(m_context, de::toString(testNdx).c_str(), "", numUnits, (TextureUnitCase::CaseType)caseType, deUint32Hash((deUint32)testNdx)));
		}
	}
}